

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O2

void __thiscall TPZOneShapeRestraint::Write(TPZOneShapeRestraint *this,TPZStream *buf)

{
  pair<long,_int> *ppVar1;
  long lVar2;
  TPZManVector<int,_4> faces;
  TPZManVector<long,_4> seqnums;
  
  TPZManVector<long,_4>::TPZManVector(&seqnums,4);
  TPZManVector<int,_4>::TPZManVector(&faces,4);
  ppVar1 = (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fStore;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 2) {
    *(long *)((long)seqnums.super_TPZVec<long>.fStore + lVar2 * 4) = (&ppVar1->first)[lVar2];
    *(int *)((long)faces.super_TPZVec<int>.fStore + lVar2 * 2) = (&ppVar1->second)[lVar2 * 2];
  }
  (*buf->_vptr_TPZStream[5])(buf,seqnums.super_TPZVec<long>.fStore,4);
  (*buf->_vptr_TPZStream[3])(buf,faces.super_TPZVec<int>.fStore,4);
  (*buf->_vptr_TPZStream[3])(buf,(this->fOrient).super_TPZVec<int>.fStore,4);
  TPZManVector<int,_4>::~TPZManVector(&faces);
  TPZManVector<long,_4>::~TPZManVector(&seqnums);
  return;
}

Assistant:

void Write(TPZStream &buf) const
    {
        TPZManVector<int64_t,4> seqnums(4);
        TPZManVector<int,4> faces(4);
        for (int i=0; i<4; i++)
        {
            seqnums[i] = fFaces[i].first;
            faces[i] = fFaces[i].second;
        }
        buf.Write(&seqnums[0],4);
        buf.Write(&faces[0],4);
        buf.Write(&fOrient[0],4);
    }